

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> * __thiscall
kj::ArrayBuilder<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_>::operator=
          (ArrayBuilder<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> *this,
          ArrayBuilder<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> *other)

{
  ArrayBuilder<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> *other_local;
  ArrayBuilder<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)0x0;
  other->pos = (RemoveConst<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> *)0x0;
  other->endPtr = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }